

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void google::protobuf::util::FieldMaskUtil::GetFieldMaskForAllFields
               (Descriptor *descriptor,FieldMask *out)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(descriptor + 0x68); lVar1 = lVar1 + 1) {
    FieldMask::add_paths(out,*(string **)(*(long *)(descriptor + 0x28) + lVar2));
    lVar2 = lVar2 + 0x98;
  }
  return;
}

Assistant:

void FieldMaskUtil::GetFieldMaskForAllFields(const Descriptor* descriptor,
                                             FieldMask* out) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    out->add_paths(descriptor->field(i)->name());
  }
}